

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

void __thiscall wasm::StackIROptimizer::removeAt(StackIROptimizer *this,Index i)

{
  pointer ppSVar1;
  StackInst *pSVar2;
  Expression *pEVar3;
  uint uVar4;
  ulong uVar5;
  
  ppSVar1 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = ppSVar1[i];
  ppSVar1[i] = (StackInst *)0x0;
  if (pSVar2->op != Basic) {
    pEVar3 = pSVar2->origin;
    uVar4 = i + 1;
    while( true ) {
      uVar5 = (ulong)uVar4;
      ppSVar1 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->insts->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar5) {
        __assert_fail("i < insts.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                      ,0x172,"void wasm::StackIROptimizer::removeAt(Index)");
      }
      pSVar2 = ppSVar1[uVar5];
      ppSVar1[uVar5] = (StackInst *)0x0;
      if ((((pSVar2 != (StackInst *)0x0) && (pSVar2->origin == pEVar3)) &&
          (pSVar2->op < (TryTableEnd|BlockBegin))) && ((0x58a4U >> (pSVar2->op & 0x1f) & 1) != 0))
      break;
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void StackIROptimizer::removeAt(Index i) {
  auto* inst = insts[i];
  insts[i] = nullptr;
  if (inst->op == StackInst::Basic) {
    return; // that was it
  }
  auto* origin = inst->origin;
  while (1) {
    i++;
    assert(i < insts.size());
    inst = insts[i];
    insts[i] = nullptr;
    if (inst && inst->origin == origin && isControlFlowEnd(inst)) {
      return; // that's it, we removed it all
    }
  }
}